

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  AssertionResult *this_00;
  OfType OVar1;
  _Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  os;
  pointer pcVar2;
  pointer pMVar3;
  pointer *ppbVar4;
  pointer pbVar5;
  bool bVar6;
  uint uVar7;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar8;
  size_t sVar9;
  char *pcVar10;
  XmlWriter *this_01;
  MessageInfo *msg;
  pointer pMVar11;
  string elementName;
  ReusableStringStream rss;
  ScopedElement e;
  char local_c9;
  Column local_c8;
  string local_98;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  ReusableStringStream local_58;
  
  OVar1 = (stats->assertionResult).m_resultData.resultType;
  if ((OVar1 & FailureBit) == Ok) {
    return;
  }
  if (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0) {
    return;
  }
  local_78 = local_68;
  local_70 = 0;
  local_68[0] = 0;
  pcVar10 = "failure";
  if (OVar1 < Exception) {
    uVar7 = OVar1 + Info;
    if (0x13 < uVar7) goto LAB_001c66f7;
    if ((0x2000fU >> (uVar7 & 0x1f) & 1) == 0) {
      if ((0xc0000U >> (uVar7 & 0x1f) & 1) == 0) goto LAB_001c66f7;
    }
    else {
LAB_001c669c:
      pcVar10 = "internalError";
    }
  }
  else {
    if (OVar1 < DidntThrowException) {
      if (OVar1 == Exception) goto LAB_001c669c;
      if (OVar1 != ThrewException) goto LAB_001c66f7;
    }
    else {
      if (OVar1 == DidntThrowException) goto LAB_001c66e9;
      if (OVar1 != FatalErrorCondition) goto LAB_001c66f7;
    }
    pcVar10 = "error";
  }
LAB_001c66e9:
  std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,(ulong)pcVar10);
LAB_001c66f7:
  this_01 = &this->xml;
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_01,(XmlFormatting)&local_78);
  ppbVar4 = (pointer *)
            ((long)&local_c8.m_strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            + 0x10);
  local_c8.m_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"message","");
  this_00 = &stats->assertionResult;
  AssertionResult::getExpression_abi_cxx11_(&local_98,this_00);
  XmlWriter::writeAttribute(this_01,(string *)&local_c8,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_c8.m_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
    operator_delete(local_c8.m_strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_c8.m_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"type","");
  local_98._M_dataplus._M_p = (stats->assertionResult).m_info.macroName.m_start;
  local_98._M_string_length = (stats->assertionResult).m_info.macroName.m_size;
  XmlWriter::writeAttribute<Catch::StringRef>(this_01,(string *)&local_c8,(StringRef *)&local_98);
  if (local_c8.m_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
    operator_delete(local_c8.m_strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_58.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_002432c8;
  pSVar8 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar9 = StringStreams::add(&pSVar8->super_StringStreams);
  local_58.m_index = sVar9;
  pSVar8 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  os._M_head_impl =
       *(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        &(pSVar8->super_StringStreams).m_streams.
         super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar9]._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  local_58.m_oss = (ostream *)os._M_head_impl;
  if ((stats->totals).assertions.failed + (stats->totals).assertions.passed +
      (stats->totals).assertions.failedButOk == 0) {
    local_c8.m_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_c8.m_strings.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os._M_head_impl,(char *)&local_c8,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,"FAILED",6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,":\n",2);
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,"  ",2);
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)&local_c8,this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os._M_head_impl,
                 (char *)local_c8.m_strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                 (long)local_c8.m_strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
      if (local_c8.m_strings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
        operator_delete(local_c8.m_strings.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_c8.m_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_c8.m_strings.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os._M_head_impl,(char *)&local_c8,1);
    }
    bVar6 = AssertionResult::hasExpandedExpression(this_00);
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os._M_head_impl,"with expansion:\n",0x10);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_98,this_00);
      clara::TextFlow::Column::Column(&local_c8,&local_98);
      local_c8.m_indent = 2;
      clara::TextFlow::operator<<((ostream *)os._M_head_impl,&local_c8);
      local_c9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,&local_c9,1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
  }
  pcVar2 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_c8.m_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,
             pcVar2 + (stats->assertionResult).m_resultData.message._M_string_length);
  pbVar5 = local_c8.m_strings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c8.m_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
    operator_delete(local_c8.m_strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pbVar5 != (pointer)0x0) {
    pcVar2 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_c8.m_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar2,
               pcVar2 + (stats->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os._M_head_impl,
               (char *)local_c8.m_strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               (long)local_c8.m_strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
    local_98._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os._M_head_impl,(char *)&local_98,1);
    if (local_c8.m_strings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
      operator_delete(local_c8.m_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  pMVar11 = (stats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar3 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar11 != pMVar3) {
    do {
      if (pMVar11->type == Info) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os._M_head_impl,(pMVar11->message)._M_dataplus._M_p,
                   (pMVar11->message)._M_string_length);
        local_c8.m_strings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_c8.m_strings.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os._M_head_impl,(char *)&local_c8,1);
      }
      pMVar11 = pMVar11 + 1;
    } while (pMVar11 != pMVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os._M_head_impl,"at ",3);
  local_c8.m_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(stats->assertionResult).m_info.lineInfo.file
  ;
  local_c8.m_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(stats->assertionResult).m_info.lineInfo.line;
  operator<<((ostream *)os._M_head_impl,(SourceLineInfo *)&local_c8);
  std::__cxx11::stringbuf::str();
  XmlWriter::writeText(this_01,(string *)&local_c8,Newline);
  if (local_c8.m_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_c8.m_strings.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               + 0x10U)) {
    operator_delete(local_c8.m_strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ReusableStringStream::~ReusableStringStream(&local_58);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

bool AssertionResult::isOk() const {
        return Catch::isOk( m_resultData.resultType ) || shouldSuppressFailure( m_info.resultDisposition );
    }